

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall crsGA::Logger::stopProcessingMessages(Logger *this)

{
  ThreadSafeQueue<crsGA::Logger::LogMessage> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  LogMessage logMessage;
  LogMessage LStack_68;
  
  LOCK();
  (this->_exit)._M_base._M_i = true;
  UNLOCK();
  this_00 = &this->_queue;
  ThreadSafeQueue<crsGA::Logger::LogMessage>::notify_and_terminate(this_00);
  if ((this->_thread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  bVar2 = ThreadSafeQueue<crsGA::Logger::LogMessage>::empty(this_00);
  if (!bVar2) {
    paVar1 = &LStack_68.msg.field_2;
    do {
      LStack_68.when.__d.__r = (duration)0;
      LStack_68.msg._M_string_length = 0;
      LStack_68.msg.field_2._M_local_buf[0] = '\0';
      LStack_68.msg._M_dataplus._M_p = (pointer)paVar1;
      bVar2 = ThreadSafeQueue<crsGA::Logger::LogMessage>::pop(this_00,&LStack_68);
      if (bVar2) {
        dispatchLogMessage(this,&LStack_68);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)LStack_68.msg._M_dataplus._M_p != paVar1) {
        operator_delete(LStack_68.msg._M_dataplus._M_p,
                        CONCAT71(LStack_68.msg.field_2._M_allocated_capacity._1_7_,
                                 LStack_68.msg.field_2._M_local_buf[0]) + 1);
      }
      bVar2 = ThreadSafeQueue<crsGA::Logger::LogMessage>::empty(this_00);
    } while (!bVar2);
  }
  return;
}

Assistant:

void Logger::stopProcessingMessages()
{
    _exit = true;
    _queue.notify_and_terminate();
    if (_thread.joinable())
        _thread.join();
    // purge messages
    while (!_queue.empty())
    {
        LogMessage logMessage;
        if (_queue.pop(logMessage))
        {
            dispatchLogMessage(logMessage);
        }
    }
}